

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,function_record *rec,char *text,type_info **types,size_t args)

{
  byte bVar1;
  pointer paVar2;
  PyTypeObject *pPVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  function_record *pfVar5;
  uint __val;
  size_t sVar6;
  undefined1 auVar7 [8];
  uint uVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  undefined8 *puVar14;
  long *plVar15;
  type_info *ptVar16;
  detail *pdVar17;
  function_record *pfVar18;
  function_record *pfVar19;
  size_type *psVar20;
  PyMethodDef *pPVar21;
  object *poVar22;
  PyObject *pPVar23;
  PyObject *pPVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ulong uVar26;
  object *object;
  handle *handle;
  handle *handle_00;
  handle *handle_01;
  handle *handle_02;
  uint uVar27;
  pointer paVar28;
  long lVar29;
  char cVar30;
  undefined8 uVar31;
  pointer pcVar32;
  ulong __val_00;
  function_record *value;
  ulong uVar33;
  uint __len;
  bool bVar34;
  accessor<pybind11::detail::accessor_policies::str_attr> local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  str local_170;
  size_t local_168;
  size_type *local_160;
  undefined1 local_158 [24];
  object local_140;
  type_info **local_138;
  cpp_function *local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_108;
  allocator local_f9;
  undefined1 local_f8 [8];
  string signature;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  function_record *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Alloc_hider local_90;
  object scope_module;
  undefined8 local_80;
  undefined8 uStack_78;
  _Alloc_hider local_70;
  capsule rec_capsule_1;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 local_50 [8];
  string signatures;
  
  pcVar12 = "";
  if (rec->name != (char *)0x0) {
    pcVar12 = rec->name;
  }
  local_168 = args;
  local_138 = types;
  local_130 = this;
  pcVar12 = strdup(pcVar12);
  rec->name = pcVar12;
  if (rec->doc != (char *)0x0) {
    pcVar13 = strdup(rec->doc);
    rec->doc = pcVar13;
  }
  paVar28 = (rec->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar2 = (rec->args).
           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = rec;
  if (paVar28 != paVar2) {
    do {
      if (paVar28->name != (char *)0x0) {
        pcVar12 = strdup(paVar28->name);
        paVar28->name = pcVar12;
      }
      if (paVar28->descr == (char *)0x0) {
        pPVar23 = (paVar28->value).m_ptr;
        if (pPVar23 != (PyObject *)0x0) {
          signature._M_string_length = (size_type)anon_var_dwarf_3c0bb;
          signature.field_2._M_allocated_capacity = 0;
          signature._M_dataplus._M_p = (pointer)pPVar23;
          detail::
          object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
          operator()((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                      *)&stack0xffffffffffffff90);
          cast<std::__cxx11::string>
                    ((enable_if_t<detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
                      *)local_50,(pybind11 *)&stack0xffffffffffffff90,object);
          auVar7 = local_50;
          pcVar12 = strdup((char *)local_50);
          paVar28->descr = pcVar12;
          if (auVar7 != (undefined1  [8])&signatures._M_string_length) {
            operator_delete((void *)auVar7,signatures._M_string_length + 1);
          }
          pybind11::object::~object((object *)&stack0xffffffffffffff90);
          pybind11::object::~object((object *)&signature.field_2._M_allocated_capacity);
        }
      }
      else {
        pcVar12 = strdup(paVar28->descr);
        paVar28->descr = pcVar12;
      }
      paVar28 = paVar28 + 1;
    } while (paVar28 != paVar2);
    pcVar12 = local_b8->name;
  }
  value = local_b8;
  iVar10 = strcmp(pcVar12,"__init__");
  if (iVar10 == 0) {
    bVar34 = true;
  }
  else {
    iVar10 = strcmp(pcVar12,"__setstate__");
    bVar34 = iVar10 == 0;
  }
  bVar1 = value->field_0x59;
  value->field_0x59 = bVar1 & 0xfe | bVar34;
  if (((bVar1 & 2) == 0 & bVar34) == 1) {
    std::__cxx11::string::string
              ((string *)local_50,(char *)(value->scope).m_ptr[1].ob_type,(allocator *)local_f8);
    std::__cxx11::string::string
              ((string *)local_f8,value->name,(allocator *)&stack0xffffffffffffff90);
    uVar31 = _PyExc_FutureWarning;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   "pybind11-bound class \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
    puVar14 = (undefined8 *)std::__cxx11::string::append(local_128);
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 == paVar25) {
      local_b0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_b0.field_2._8_8_ = puVar14[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_b0._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_b0._M_string_length = puVar14[1];
    *puVar14 = paVar25;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_f8);
    pPVar23 = (PyObject *)(plVar15 + 2);
    if ((PyObject *)*plVar15 == pPVar23) {
      local_80 = pPVar23->ob_refcnt;
      uStack_78 = plVar15[3];
      local_90._M_p = (pointer)&stack0xffffffffffffff80;
    }
    else {
      local_80 = pPVar23->ob_refcnt;
      local_90._M_p = (pointer)*plVar15;
    }
    scope_module.super_handle.m_ptr = (handle)plVar15[1];
    *plVar15 = (long)pPVar23;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff70);
    pPVar23 = (PyObject *)(plVar15 + 2);
    if ((PyObject *)*plVar15 == pPVar23) {
      local_60 = pPVar23->ob_refcnt;
      uStack_58 = plVar15[3];
      local_70._M_p = (pointer)&stack0xffffffffffffffa0;
    }
    else {
      local_60 = pPVar23->ob_refcnt;
      local_70._M_p = (pointer)*plVar15;
    }
    rec_capsule_1.super_object.super_handle.m_ptr = (object)((handle *)(plVar15 + 1))->m_ptr;
    *plVar15 = (long)pPVar23;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    PyErr_WarnEx(uVar31,local_70._M_p,0);
    if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
      operator_delete(local_70._M_p,local_60 + 1);
    }
    if ((PyObject *)local_90._M_p != (PyObject *)&stack0xffffffffffffff80) {
      operator_delete(local_90._M_p,(ulong)(local_80 + 1));
    }
    value = local_b8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_128._0_8_ != local_118) {
      operator_delete((void *)local_128._0_8_,(ulong)(local_118._0_8_ + 1));
    }
    if (local_f8 != (undefined1  [8])&signature._M_string_length) {
      operator_delete((void *)local_f8,signature._M_string_length + 1);
    }
    if (local_50 != (undefined1  [8])&signatures._M_string_length) {
      operator_delete((void *)local_50,signatures._M_string_length + 1);
    }
  }
  local_108 = &value->args;
  local_f8 = (undefined1  [8])&signature._M_string_length;
  signature._M_dataplus._M_p = (pointer)0x0;
  signature._M_string_length = signature._M_string_length & 0xffffffffffffff00;
  local_160 = &signatures._M_string_length;
  uVar33 = 0;
  pcVar12 = (char *)0x0;
  do {
    sVar6 = local_168;
    bVar1 = *text;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x25) {
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138[(long)pcVar12];
        if (paVar25 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_50 = (undefined1  [8])paVar25;
        ptVar16 = detail::get_type_info((type_index *)local_50,false);
        pcVar12 = (char *)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pcVar12)->_M_dataplus)._M_p + 1);
        if (ptVar16 == (type_info *)0x0) {
          if ((uVar33 == 0 & (byte)value->field_0x59 >> 1) != 1) {
            std::__cxx11::string::string
                      ((string *)local_50,
                       (char *)((long)&((*(PyTypeObject **)((long)paVar25 + 8))->ob_base).ob_base.
                                       ob_refcnt +
                               (ulong)((char)((*(PyTypeObject **)((long)paVar25 + 8))->ob_base).
                                             ob_base.ob_refcnt == '*')),
                       (allocator *)&stack0xffffffffffffff90);
            detail::clean_type_id((string *)local_50);
            std::__cxx11::string::_M_append(local_f8,(ulong)local_50);
            if (local_50 != (undefined1  [8])&signatures._M_string_length) {
              operator_delete((void *)local_50,signatures._M_string_length + 1);
            }
            goto LAB_0010baef;
          }
          local_128._8_8_ = (value->scope).m_ptr;
          local_118._0_8_ = "__module__";
          local_118._8_8_ = 0;
          pdVar17 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_128)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_50,pdVar17,handle_00);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          if (local_50 == (undefined1  [8])&signatures._M_string_length) {
            local_b0.field_2._8_8_ = signatures.field_2._M_allocated_capacity;
          }
          else {
            local_b0._M_dataplus._M_p = (pointer)local_50;
          }
          local_b0.field_2._M_allocated_capacity = signatures._M_string_length;
          local_b0._M_string_length = (size_type)signatures._M_dataplus._M_p;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_b0);
          pPVar23 = (PyObject *)(plVar15 + 2);
          if ((PyObject *)*plVar15 == pPVar23) {
            local_80 = pPVar23->ob_refcnt;
            uStack_78 = plVar15[3];
            local_90._M_p = (pointer)&stack0xffffffffffffff80;
          }
          else {
            local_80 = pPVar23->ob_refcnt;
            local_90._M_p = (pointer)*plVar15;
          }
          scope_module.super_handle.m_ptr = (handle)plVar15[1];
          *plVar15 = (long)pPVar23;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          local_158._8_8_ = (value->scope).m_ptr;
          local_158._16_8_ = "__qualname__";
          local_140.super_handle.m_ptr = (handle)(PyObject *)0x0;
          pdVar17 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_158)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_50,pdVar17,handle_02);
          signature.field_2._8_8_ = local_50;
          if (local_50 == (undefined1  [8])&signatures._M_string_length) {
            local_c8._8_8_ = signatures.field_2._M_allocated_capacity;
            signature.field_2._8_8_ = &local_c8;
          }
          local_c8._M_allocated_capacity = signatures._M_string_length;
          uVar31 = (pointer)0xf;
          if ((PyObject *)local_90._M_p != (PyObject *)&stack0xffffffffffffff80) {
            uVar31 = local_80;
          }
          if ((ulong)uVar31 < signatures._M_dataplus._M_p + (long)scope_module.super_handle.m_ptr) {
            pcVar32 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)signature.field_2._8_8_ != &local_c8) {
              pcVar32 = (pointer)signatures._M_string_length;
            }
            if (pcVar32 < signatures._M_dataplus._M_p + (long)scope_module.super_handle.m_ptr)
            goto LAB_0010b904;
            plVar15 = (long *)std::__cxx11::string::replace
                                        ((ulong)((long)&signature.field_2 + 8),0,(char *)0x0,
                                         (ulong)local_90._M_p);
          }
          else {
LAB_0010b904:
            plVar15 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&stack0xffffffffffffff70,signature.field_2._8_8_);
          }
          pPVar23 = (PyObject *)(plVar15 + 2);
          if ((PyObject *)*plVar15 == pPVar23) {
            local_60 = pPVar23->ob_refcnt;
            uStack_58 = plVar15[3];
            local_70._M_p = (pointer)&stack0xffffffffffffffa0;
          }
          else {
            local_60 = pPVar23->ob_refcnt;
            local_70._M_p = (pointer)*plVar15;
          }
          rec_capsule_1.super_object.super_handle.m_ptr = (object)((handle *)(plVar15 + 1))->m_ptr;
          *plVar15 = (long)pPVar23;
          plVar15[1] = 0;
          *(undefined1 *)&pPVar23->ob_refcnt = 0;
          std::__cxx11::string::_M_append(local_f8,(ulong)local_70._M_p);
          if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
            operator_delete(local_70._M_p,local_60 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)signature.field_2._8_8_ != &local_c8) {
            operator_delete((void *)signature.field_2._8_8_,local_c8._M_allocated_capacity + 1);
          }
          pybind11::object::~object(&local_140);
          if ((PyObject *)local_90._M_p != (PyObject *)&stack0xffffffffffffff80) {
            operator_delete(local_90._M_p,(ulong)(local_80 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          pybind11::object::~object((object *)(local_118 + 8));
          uVar33 = 0;
        }
        else {
          pPVar3 = ptVar16->type;
          local_118._0_8_ = "__module__";
          local_118._8_8_ = 0;
          local_128._8_8_ = pPVar3;
          pdVar17 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_128)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_50,pdVar17,handle);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          if (local_50 == (undefined1  [8])&signatures._M_string_length) {
            local_b0.field_2._8_8_ = signatures.field_2._M_allocated_capacity;
          }
          else {
            local_b0._M_dataplus._M_p = (pointer)local_50;
          }
          local_b0.field_2._M_allocated_capacity = signatures._M_string_length;
          local_b0._M_string_length = (size_type)signatures._M_dataplus._M_p;
          plVar15 = (long *)std::__cxx11::string::append((char *)&local_b0);
          local_90._M_p = (pointer)&stack0xffffffffffffff80;
          pPVar23 = (PyObject *)(plVar15 + 2);
          if ((PyObject *)*plVar15 == pPVar23) {
            local_80 = pPVar23->ob_refcnt;
            uStack_78 = plVar15[3];
          }
          else {
            local_80 = pPVar23->ob_refcnt;
            local_90._M_p = (pointer)*plVar15;
          }
          scope_module.super_handle.m_ptr = (handle)plVar15[1];
          *plVar15 = (long)pPVar23;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          local_158._16_8_ = "__qualname__";
          local_140.super_handle.m_ptr = (handle)(PyObject *)0x0;
          local_158._8_8_ = pPVar3;
          pdVar17 = (detail *)
                    detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_158)
          ;
          detail::load_type<std::__cxx11::string>
                    ((make_caster<std::__cxx11::basic_string<char>_> *)local_50,pdVar17,handle_01);
          signature.field_2._8_8_ = local_50;
          if (local_50 == (undefined1  [8])&signatures._M_string_length) {
            local_c8._8_8_ = signatures.field_2._M_allocated_capacity;
            signature.field_2._8_8_ = &local_c8;
          }
          local_c8._M_allocated_capacity = signatures._M_string_length;
          uVar31 = (pointer)0xf;
          if ((PyObject *)local_90._M_p != (PyObject *)&stack0xffffffffffffff80) {
            uVar31 = local_80;
          }
          if ((ulong)uVar31 < signatures._M_dataplus._M_p + (long)scope_module.super_handle.m_ptr) {
            pcVar32 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)signature.field_2._8_8_ != &local_c8) {
              pcVar32 = (pointer)signatures._M_string_length;
            }
            if (pcVar32 < signatures._M_dataplus._M_p + (long)scope_module.super_handle.m_ptr)
            goto LAB_0010b67b;
            plVar15 = (long *)std::__cxx11::string::replace
                                        ((ulong)((long)&signature.field_2 + 8),0,(char *)0x0,
                                         (ulong)local_90._M_p);
          }
          else {
LAB_0010b67b:
            plVar15 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&stack0xffffffffffffff70,signature.field_2._8_8_);
          }
          local_70._M_p = (pointer)&stack0xffffffffffffffa0;
          pPVar23 = (PyObject *)(plVar15 + 2);
          if ((PyObject *)*plVar15 == pPVar23) {
            local_60 = pPVar23->ob_refcnt;
            uStack_58 = plVar15[3];
          }
          else {
            local_60 = pPVar23->ob_refcnt;
            local_70._M_p = (pointer)*plVar15;
          }
          rec_capsule_1.super_object.super_handle.m_ptr = (object)((handle *)(plVar15 + 1))->m_ptr;
          *plVar15 = (long)pPVar23;
          plVar15[1] = 0;
          *(undefined1 *)&pPVar23->ob_refcnt = 0;
          std::__cxx11::string::_M_append(local_f8,(ulong)local_70._M_p);
          if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
            operator_delete(local_70._M_p,local_60 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)signature.field_2._8_8_ != &local_c8) {
            operator_delete((void *)signature.field_2._8_8_,local_c8._M_allocated_capacity + 1);
          }
          pybind11::object::~object(&local_140);
          if ((PyObject *)local_90._M_p != (PyObject *)&stack0xffffffffffffff80) {
            operator_delete(local_90._M_p,(ulong)(local_80 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          pybind11::object::~object((object *)(local_118 + 8));
        }
      }
      else {
        if (bVar1 == 0) break;
LAB_0010b4a0:
        std::__cxx11::string::push_back((char)local_f8);
      }
    }
    else if (bVar1 == 0x7b) {
      if (((byte *)text)[1] != 0x2a) {
        paVar28 = (value->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((uVar33 < (ulong)((long)(value->args).
                                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)paVar28 >> 5
                              )) && (paVar28[uVar33].name != (char *)0x0)) ||
           ((value->field_0x59 & 0x40) != 0 && uVar33 == 0)) {
          std::__cxx11::string::append(local_f8);
        }
        else {
          __val_00 = uVar33 - (((byte)value->field_0x59 >> 6 & 1) != 0);
          cVar30 = '\x01';
          if (9 < __val_00) {
            uVar26 = __val_00;
            cVar9 = '\x04';
            do {
              cVar30 = cVar9;
              if (uVar26 < 100) {
                cVar30 = cVar30 + -2;
                goto LAB_0010ba0e;
              }
              if (uVar26 < 1000) {
                cVar30 = cVar30 + -1;
                goto LAB_0010ba0e;
              }
              if (uVar26 < 10000) goto LAB_0010ba0e;
              bVar34 = 99999 < uVar26;
              uVar26 = uVar26 / 10000;
              cVar9 = cVar30 + '\x04';
            } while (bVar34);
            cVar30 = cVar30 + '\x01';
          }
LAB_0010ba0e:
          local_70._M_p = (pointer)&stack0xffffffffffffffa0;
          std::__cxx11::string::_M_construct((ulong)&stack0xffffffffffffff90,cVar30);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_70._M_p,(uint)rec_capsule_1.super_object.super_handle.m_ptr,__val_00);
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&stack0xffffffffffffff90,0,(char *)0x0,0x1188e2);
          value = local_b8;
          local_50 = (undefined1  [8])&signatures._M_string_length;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar14 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 == paVar25) {
            signatures._M_string_length = paVar25->_M_allocated_capacity;
            signatures.field_2._M_allocated_capacity = puVar14[3];
          }
          else {
            signatures._M_string_length = paVar25->_M_allocated_capacity;
            local_50 = (undefined1  [8])*puVar14;
          }
          signatures._M_dataplus._M_p = (pointer)puVar14[1];
          *puVar14 = paVar25;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          std::__cxx11::string::_M_append(local_f8,(ulong)local_50);
          if (local_50 != (undefined1  [8])&signatures._M_string_length) {
            operator_delete((void *)local_50,signatures._M_string_length + 1);
          }
          if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
            operator_delete(local_70._M_p,local_60 + 1);
          }
        }
        std::__cxx11::string::append(local_f8);
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_0010b4a0;
      paVar28 = (value->args).
                super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar33 < (ulong)((long)(value->args).
                                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)paVar28 >> 5))
         && (paVar28[uVar33].descr != (char *)0x0)) {
        std::__cxx11::string::append(local_f8);
        std::__cxx11::string::append(local_f8);
      }
      uVar33 = uVar33 + 1;
    }
LAB_0010baef:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((uVar33 != local_168) || (local_138[(long)pcVar12] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar13 = strdup((char *)local_f8);
  value->signature = pcVar13;
  if ((value->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (value->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_108);
  }
  value->nargs = (uint16_t)sVar6;
  pPVar23 = (value->sibling).m_ptr;
  if (pPVar23 == (PyObject *)0x0) {
LAB_0010bc95:
    pPVar21 = (PyMethodDef *)operator_new(0x20);
    value->def = pPVar21;
    *(undefined8 *)&pPVar21->ml_flags = 0;
    pPVar21->ml_doc = (char *)0x0;
    pPVar21->ml_name = value->name;
    pPVar21->ml_meth = dispatcher;
    pPVar21->ml_flags = 3;
    capsule::capsule((capsule *)&stack0xffffffffffffff90,value,
                     initialize_generic::anon_class_1_0_00000001::__invoke);
    local_90._M_p = (pointer)0x0;
    pPVar23 = (value->scope).m_ptr;
    if (pPVar23 != (PyObject *)0x0) {
      iVar10 = PyObject_HasAttrString(pPVar23,"__module__");
      if (iVar10 == 1) {
        signatures._M_dataplus._M_p = (pointer)(value->scope).m_ptr;
        signatures._M_string_length = (size_type)anon_var_dwarf_3b89f;
        signatures.field_2._M_allocated_capacity = 0;
        poVar22 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_50);
      }
      else {
        pcVar12 = "__name__";
        iVar10 = PyObject_HasAttrString((value->scope).m_ptr,"__name__");
        if (iVar10 != 1) goto LAB_0010bd99;
        signatures._M_dataplus._M_p = (pointer)(value->scope).m_ptr;
        signatures._M_string_length = (size_type)anon_var_dwarf_3b563;
        signatures.field_2._M_allocated_capacity = 0;
        poVar22 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_50);
      }
      local_b0._M_dataplus._M_p = (pointer)(poVar22->super_handle).m_ptr;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        *(size_type *)local_b0._M_dataplus._M_p = *(size_type *)local_b0._M_dataplus._M_p + 1;
      }
      pcVar12 = (char *)&local_b0;
      pybind11::object::operator=((object *)&stack0xffffffffffffff70,(object *)pcVar12);
      pybind11::object::~object((object *)pcVar12);
      pybind11::object::~object((object *)&signatures.field_2._M_allocated_capacity);
    }
LAB_0010bd99:
    pPVar23 = (PyObject *)PyCMethod_New(value->def,local_70._M_p,local_90._M_p,0);
    (local_130->super_function).super_object.super_handle.m_ptr = pPVar23;
    if (pPVar23 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
    }
    pybind11::object::~object((object *)&stack0xffffffffffffff70);
    pybind11::object::~object((object *)&stack0xffffffffffffff90);
    psVar20 = &signatures._M_string_length;
    signatures._M_dataplus._M_p = (pointer)0x0;
    signatures._M_string_length = signatures._M_string_length & 0xffffffffffffff00;
    uVar33 = CONCAT71((int7)((ulong)pcVar12 >> 8),1);
    pfVar18 = value;
    local_160 = psVar20;
    local_50 = (undefined1  [8])psVar20;
  }
  else {
    if (pPVar23->ob_type == (PyTypeObject *)&PyInstanceMethod_Type) {
      pPVar23 = (PyObject *)pPVar23[1].ob_refcnt;
      (value->sibling).m_ptr = pPVar23;
      if (pPVar23 == (PyObject *)0x0) goto LAB_0010bc95;
    }
    if (pPVar23->ob_type != (PyTypeObject *)&PyCFunction_Type) {
      iVar10 = PyType_IsSubtype(pPVar23->ob_type,&PyCFunction_Type);
      pPVar23 = (value->sibling).m_ptr;
      if (iVar10 == 0) {
        if ((pPVar23 != (PyObject *)&_Py_NoneStruct) && (*value->name != '_')) {
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffff70,value->name,(allocator *)&local_b0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff90,"Cannot overload existing non-function object \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &stack0xffffffffffffff70);
          plVar15 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff90);
          local_50 = (undefined1  [8])*plVar15;
          psVar20 = (size_type *)(plVar15 + 2);
          if (local_50 == (undefined1  [8])psVar20) {
            signatures._M_string_length = *psVar20;
            signatures.field_2._M_allocated_capacity = plVar15[3];
            local_50 = (undefined1  [8])&signatures._M_string_length;
          }
          else {
            signatures._M_string_length = *psVar20;
          }
          signatures._M_dataplus._M_p = (pointer)plVar15[1];
          *plVar15 = (long)psVar20;
          plVar15[1] = 0;
          *(undefined1 *)(plVar15 + 2) = 0;
          pybind11_fail((string *)local_50);
        }
        goto LAB_0010bc95;
      }
    }
    if ((*(byte *)(pPVar23[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_50 = (undefined1  [8])pPVar23[1].ob_type;
      if (local_50 != (undefined1  [8])0x0) {
        *(size_type *)local_50 = *(size_type *)local_50 + 1;
      }
    }
    else {
      local_50 = (undefined1  [8])0x0;
    }
    pfVar18 = capsule::operator_cast_to_function_record_((capsule *)local_50);
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (pfVar18->scope).m_ptr;
    pcVar12 = (char *)(value->scope).m_ptr;
    pybind11::object::~object((object *)local_50);
    if (pbVar4 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar12)
    goto LAB_0010bc95;
    pPVar23 = (value->sibling).m_ptr;
    (local_130->super_function).super_object.super_handle.m_ptr = pPVar23;
    if (pPVar23 != (PyObject *)0x0) {
      pPVar23->ob_refcnt = pPVar23->ob_refcnt + 1;
    }
    bVar1 = value->field_0x59;
    pfVar5 = pfVar18;
    if (((pfVar18->field_0x59 ^ bVar1) & 0x40) != 0) {
      pcVar12 = "instance";
      if ((bVar1 & 0x40) == 0) {
        pcVar12 = "static";
      }
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,pcVar12,pcVar12 + (ulong)((bVar1 & 0x40) >> 6) * 2 + 6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&signature.field_2 + 8),
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158
                    );
      plVar15 = (long *)std::__cxx11::string::append(signature.field_2._M_local_buf + 8);
      local_128._0_8_ = *plVar15;
      psVar20 = (size_type *)(plVar15 + 2);
      if ((size_type *)local_128._0_8_ == psVar20) {
        local_118._0_8_ = *psVar20;
        local_118._8_8_ = plVar15[3];
        local_128._0_8_ = local_118;
      }
      else {
        local_118._0_8_ = *psVar20;
      }
      local_128._8_8_ = plVar15[1];
      *plVar15 = (long)psVar20;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      local_1d0.obj.m_ptr = (local_b8->scope).m_ptr;
      local_1d0.key = "__name__";
      local_1d0.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      str::str<pybind11::detail::accessor_policies::str_attr>(&local_170,&local_1d0);
      str::operator_cast_to_string(&local_1b0,&local_170);
      std::operator+(&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     &local_1b0);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_90._M_p = (pointer)*plVar15;
      pPVar23 = (PyObject *)(plVar15 + 2);
      if ((PyObject *)local_90._M_p == pPVar23) {
        local_80 = pPVar23->ob_refcnt;
        uStack_78 = plVar15[3];
        local_90._M_p = (pointer)&stack0xffffffffffffff80;
      }
      else {
        local_80 = pPVar23->ob_refcnt;
      }
      scope_module.super_handle.m_ptr = (handle)plVar15[1];
      *plVar15 = (long)pPVar23;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      std::__cxx11::string::string((string *)&local_190,local_b8->name,&local_f9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff70,&local_190);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      pybind11_fail((string *)local_50);
    }
    do {
      pfVar19 = pfVar5;
      pfVar5 = pfVar19->next;
    } while (pfVar5 != (function_record *)0x0);
    pfVar19->next = value;
    psVar20 = &signatures._M_string_length;
    signatures._M_dataplus._M_p = (pointer)0x0;
    signatures._M_string_length = signatures._M_string_length & 0xffffffffffffff00;
    local_50 = (undefined1  [8])psVar20;
    if (DAT_00121559 == 1) {
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::append(local_50);
      psVar20 = (size_type *)std::__cxx11::string::append(local_50);
    }
    if (pfVar18 == (function_record *)0x0) goto LAB_0010c042;
    uVar33 = 0;
  }
  iVar10 = 0;
  local_108 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               *)CONCAT44(local_108._4_4_,(int)CONCAT71((int7)((ulong)psVar20 >> 8),1));
  local_168 = CONCAT44(local_168._4_4_,(int)uVar33);
  do {
    if (DAT_00121559 == 1) {
      if (0 < iVar10) {
        std::__cxx11::string::append(local_50);
      }
      if ((char)uVar33 == '\0') {
        uVar27 = iVar10 + 1;
        __val = -uVar27;
        if (0 < (int)uVar27) {
          __val = uVar27;
        }
        __len = 1;
        if (9 < __val) {
          uVar33 = (ulong)__val;
          uVar8 = 4;
          do {
            __len = uVar8;
            uVar11 = (uint)uVar33;
            if (uVar11 < 100) {
              __len = __len - 2;
              goto LAB_0010be95;
            }
            if (uVar11 < 1000) {
              __len = __len - 1;
              goto LAB_0010be95;
            }
            if (uVar11 < 10000) goto LAB_0010be95;
            uVar33 = uVar33 / 10000;
            uVar8 = __len + 4;
          } while (99999 < uVar11);
          __len = __len + 1;
        }
LAB_0010be95:
        local_138 = (type_info **)CONCAT44(local_138._4_4_,uVar27);
        local_90._M_p = (pointer)&stack0xffffffffffffff80;
        std::__cxx11::string::_M_construct
                  ((ulong)&stack0xffffffffffffff70,(char)__len - (char)((int)uVar27 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_90._M_p + (uVar27 >> 0x1f),__len,__val);
        plVar15 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff70);
        value = local_b8;
        local_70._M_p = (pointer)&stack0xffffffffffffffa0;
        pPVar23 = (PyObject *)(plVar15 + 2);
        uVar33 = local_168 & 0xffffffff;
        iVar10 = (int)local_138;
        if ((PyObject *)*plVar15 == pPVar23) {
          local_60 = pPVar23->ob_refcnt;
          uStack_58 = plVar15[3];
        }
        else {
          local_60 = pPVar23->ob_refcnt;
          local_70._M_p = (pointer)*plVar15;
        }
        rec_capsule_1.super_object.super_handle.m_ptr = (object)((handle *)(plVar15 + 1))->m_ptr;
        *plVar15 = (long)pPVar23;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        std::__cxx11::string::_M_append(local_50,(ulong)local_70._M_p);
        if ((PyObject *)local_70._M_p != (PyObject *)&stack0xffffffffffffffa0) {
          operator_delete(local_70._M_p,local_60 + 1);
        }
        if ((PyObject *)local_90._M_p != (PyObject *)&stack0xffffffffffffff80) {
          operator_delete(local_90._M_p,(ulong)(local_80 + 1));
        }
      }
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::append(local_50);
      std::__cxx11::string::append(local_50);
    }
    if (((pfVar18->doc != (char *)0x0) && (*pfVar18->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (((DAT_00121559 | (byte)local_108) & 1) == 0) {
        std::__cxx11::string::append(local_50);
        local_108 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     *)((ulong)local_108 & 0xffffffff00000000);
      }
      else {
        local_108 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     *)CONCAT44(local_108._4_4_,
                                CONCAT31((int3)((ulong)local_108 >> 8),
                                         (byte)local_108 & DAT_00121559));
      }
      if ((DAT_00121559 & 1) != 0) {
        std::__cxx11::string::append(local_50);
      }
      std::__cxx11::string::append(local_50);
      if (DAT_00121559 == 1) {
        std::__cxx11::string::append(local_50);
      }
    }
    pfVar18 = pfVar18->next;
  } while (pfVar18 != (function_record *)0x0);
LAB_0010c042:
  pPVar23 = (local_130->super_function).super_object.super_handle.m_ptr;
  lVar29 = pPVar23[1].ob_refcnt;
  if (*(void **)(lVar29 + 0x18) != (void *)0x0) {
    free(*(void **)(lVar29 + 0x18));
    lVar29 = pPVar23[1].ob_refcnt;
  }
  pcVar12 = strdup((char *)local_50);
  psVar20 = local_160;
  *(char **)(lVar29 + 0x18) = pcVar12;
  if ((value->field_0x59 & 0x40) != 0) {
    pPVar24 = (PyObject *)
              PyInstanceMethod_New((local_130->super_function).super_object.super_handle.m_ptr);
    (local_130->super_function).super_object.super_handle.m_ptr = pPVar24;
    if (pPVar24 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
    }
    pPVar23->ob_refcnt = pPVar23->ob_refcnt + -1;
    if (pPVar23->ob_refcnt == 0) {
      _Py_Dealloc(pPVar23);
    }
  }
  if (local_50 != (undefined1  [8])psVar20) {
    operator_delete((void *)local_50,signatures._M_string_length + 1);
  }
  if (local_f8 != (undefined1  [8])&signature._M_string_length) {
    operator_delete((void *)local_f8,signature._M_string_length + 1);
  }
  return;
}

Assistant:

void initialize_generic(detail::function_record *rec, const char *text,
                            const std::type_info *const *types, size_t args) {

        /* Create copies of all referenced C-style strings */
        rec->name = strdup(rec->name ? rec->name : "");
        if (rec->doc) rec->doc = strdup(rec->doc);
        for (auto &a: rec->args) {
            if (a.name)
                a.name = strdup(a.name);
            if (a.descr)
                a.descr = strdup(a.descr);
            else if (a.value)
                a.descr = strdup(a.value.attr("__repr__")().cast<std::string>().c_str());
        }

        rec->is_constructor = !strcmp(rec->name, "__init__") || !strcmp(rec->name, "__setstate__");

#if !defined(NDEBUG) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name = std::string(((PyTypeObject *) rec->scope.ptr())->tp_name);
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(
                PyExc_FutureWarning,
                ("pybind11-bound class '" + class_name + "' is using an old-style "
                 "placement-new '" + func_name + "' which has been deprecated. See "
                 "the upgrade guide in pybind11's docs. This message is only visible "
                 "when compiled in debug mode.").c_str(), 0
            );
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        for (auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                if (*(pc + 1) == '*')
                    continue;

                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += rec->args[arg_index].descr;
                }
                arg_index++;
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t)
                    pybind11_fail("Internal error while parsing type signature (1)");
                if (auto tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature +=
                        th.attr("__module__").cast<std::string>() + "." +
                        th.attr("__qualname__").cast<std::string>(); // Python 3.3+, but we backport it to earlier versions
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature +=
                        rec->scope.attr("__module__").cast<std::string>() + "." +
                        rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    std::string tname(t->name());
                    detail::clean_type_id(tname);
                    signature += tname;
                }
            } else {
                signature += c;
            }
        }
        if (arg_index != args || types[type_index] != nullptr)
            pybind11_fail("Internal error while parsing type signature (2)");

#if PY_MAJOR_VERSION < 3
        if (strcmp(rec->name, "__next__") == 0) {
            std::free(rec->name);
            rec->name = strdup("next");
        } else if (strcmp(rec->name, "__bool__") == 0) {
            std::free(rec->name);
            rec->name = strdup("__nonzero__");
        }
#endif
        rec->signature = strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr()))
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto rec_capsule = reinterpret_borrow<capsule>(PyCFunction_GET_SELF(rec->sibling.ptr()));
                chain = (detail::function_record *) rec_capsule;
                /* Never append a method to an overload chain of a parent class;
                   instead, hide the parent's overloads in this case */
                if (!chain->scope.is(rec->scope))
                    chain = nullptr;
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_')
                pybind11_fail("Cannot overload existing non-function object \"" + std::string(rec->name) +
                        "\" with a function of the same name");
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*) (void)>(*dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(rec, [](void *ptr) {
                destruct((detail::function_record *) ptr);
            });

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
        } else {
            /* Append at the end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            chain_start = chain;
            if (chain->is_method != rec->is_method)
                pybind11_fail("overloading a method with both static and instance methods is not supported; "
                    #if defined(NDEBUG)
                        "compile in debug mode for more details"
                    #else
                        "error while attempting to bind " + std::string(rec->is_method ? "instance" : "static") + " method " +
                        std::string(pybind11::str(rec->scope.attr("__name__"))) + "." + std::string(rec->name) + signature
                    #endif
                );
            while (chain->next)
                chain = chain->next;
            chain->next = rec;
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) signatures += "\n";
                if (chain)
                    signatures += std::to_string(++index) + ". ";
                signatures += rec->name;
                signatures += it->signature;
                signatures += "\n";
            }
            if (it->doc && strlen(it->doc) > 0 && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures, we
                // need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) first_user_def = false;
                    else signatures += "\n";
                }
                if (options::show_function_signatures()) signatures += "\n";
                signatures += it->doc;
                if (options::show_function_signatures()) signatures += "\n";
            }
        }

        /* Install docstring */
        PyCFunctionObject *func = (PyCFunctionObject *) m_ptr;
        if (func->m_ml->ml_doc)
            std::free(const_cast<char *>(func->m_ml->ml_doc));
        func->m_ml->ml_doc = strdup(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr)
                pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
            Py_DECREF(func);
        }
    }